

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_9d1d6::GraphEdgeClipper::GetCrossedVertexIndex
          (GraphEdgeClipper *this,vector<int,_std::allocator<int>_> *a,CrossingGraphEdgeVector *b,
          bool left_to_right)

{
  Graph *pGVar1;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pCVar6;
  const_reference pvVar7;
  S2Point *a_00;
  S2Point *b_00;
  S2Point *c;
  S2Point *o;
  int *piVar8;
  ostream *poVar9;
  const_iterator pCVar10;
  int vrank;
  int ai_1;
  CrossingGraphEdge *e_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  CrossingGraphEdgeVector *__range1_1;
  S2LogMessage local_108;
  S2LogMessageVoidify local_f5;
  int local_f4;
  int local_f0;
  int best;
  int local_e8;
  int iStack_e4;
  bool on_left_1;
  CrossingGraphEdge *local_e0;
  CrossingGraphEdge *e_1;
  const_iterator __end2;
  const_iterator __begin2;
  CrossingGraphEdgeVector *__range2;
  int local_b8;
  int max_rank;
  int min_rank;
  int local_ac;
  bool on_left;
  const_iterator pCStack_a8;
  int ai;
  CrossingGraphEdge *e;
  const_iterator __end1;
  const_iterator __begin1;
  CrossingGraphEdgeVector *__range1;
  int local_80;
  EdgeId b_last;
  EdgeId b_first;
  int hi;
  int lo;
  bool b_reversed;
  int n;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_2a;
  byte local_29;
  CrossingGraphEdgeVector *pCStack_28;
  bool left_to_right_local;
  CrossingGraphEdgeVector *b_local;
  vector<int,_std::allocator<int>_> *a_local;
  GraphEdgeClipper *this_local;
  
  local_29 = left_to_right;
  pCStack_28 = b;
  b_local = (CrossingGraphEdgeVector *)a;
  a_local = (vector<int,_std::allocator<int>_> *)this;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(a);
  local_41 = 0;
  if (bVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x218,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar9 = S2LogMessage::stream(&local_40);
    poVar9 = std::operator<<(poVar9,"Check failed: !a.empty() ");
    S2LogMessageVoidify::operator&(&local_2a,poVar9);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  bVar2 = absl::
          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
          ::empty(pCStack_28);
  b_reversed = false;
  if (bVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&n,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x219,kFatal,(ostream *)&std::cerr);
    b_reversed = true;
    poVar9 = S2LogMessage::stream((S2LogMessage *)&n);
    poVar9 = std::operator<<(poVar9,"Check failed: !b.empty() ");
    S2LogMessageVoidify::operator&(local_55,poVar9);
  }
  if ((b_reversed & 1U) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&n);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)b_local)
  ;
  lo = (int)sVar5;
  if (lo == 1) {
    this_local._4_4_ = 0;
  }
  else {
    pCVar6 = absl::
             InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
             ::operator[](pCStack_28,0);
    iVar3 = pCVar6->a_index;
    pCVar6 = absl::
             InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
             ::back(pCStack_28);
    if (iVar3 == pCVar6->a_index) {
      pCVar6 = absl::
               InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
               ::operator[](pCStack_28,0);
      this_local._4_4_ = pCVar6->a_index;
    }
    else {
      pCVar6 = absl::
               InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
               ::operator[](pCStack_28,0);
      iVar3 = GetVertexRank(this,pCVar6);
      pCVar6 = absl::
               InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
               ::back(pCStack_28);
      iVar4 = GetVertexRank(this,pCVar6);
      hi._3_1_ = iVar4 < iVar3;
      b_first = -1;
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
      b_last = (EdgeId)sVar5;
      local_80 = -1;
      __range1._4_4_ = -1;
      __begin1 = (const_iterator)pCStack_28;
      __end1 = absl::
               InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
               ::begin(pCStack_28);
      e = absl::
          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
          ::end((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                 *)__begin1);
      for (; __end1 != e; __end1 = __end1 + 1) {
        pCStack_a8 = __end1;
        local_ac = __end1->a_index;
        if (local_ac == 0) {
          if (((__end1->outgoing & 1U) != (hi._3_1_ & 1)) &&
             (iVar3 = __end1->dst,
             pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)b_local,1), iVar3 != *pvVar7))
          {
            local_80 = pCStack_a8->id;
          }
        }
        else if (local_ac == lo + -1) {
          if (((__end1->outgoing & 1U) == (hi._3_1_ & 1)) &&
             (iVar3 = __end1->dst,
             pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)b_local,(long)(lo + -2)),
             iVar3 != *pvVar7)) {
            __range1._4_4_ = pCStack_a8->id;
          }
        }
        else {
          iVar3 = __end1->dst;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)b_local,(long)(local_ac + -1));
          if ((iVar3 != *pvVar7) &&
             (iVar3 = pCStack_a8->dst,
             pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)b_local,(long)(local_ac + 1)),
             iVar3 != *pvVar7)) {
            pGVar1 = this->g_;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)b_local,(long)(local_ac + 1));
            a_00 = S2Builder::Graph::vertex(pGVar1,*pvVar7);
            b_00 = S2Builder::Graph::vertex(this->g_,pCStack_a8->dst);
            pGVar1 = this->g_;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)b_local,(long)(local_ac + -1));
            c = S2Builder::Graph::vertex(pGVar1,*pvVar7);
            pGVar1 = this->g_;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)b_local,(long)local_ac);
            o = S2Builder::Graph::vertex(pGVar1,*pvVar7);
            min_rank._3_1_ = s2pred::OrderedCCW(a_00,b_00,c,o);
            if ((local_29 & 1) == min_rank._3_1_) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->rank_,(long)pCStack_a8->id);
              max_rank = *pvVar7 + 1;
              piVar8 = std::max<int>(&b_first,&max_rank);
              b_first = *piVar8;
            }
            else {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->rank_,(long)pCStack_a8->id);
              piVar8 = std::min<int>(&b_last,pvVar7);
              b_last = *piVar8;
            }
          }
        }
      }
      if ((-1 < local_80) && (-1 < __range1._4_4_)) {
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->order_);
        local_b8 = (int)sVar5;
        __range2._4_4_ = -1;
        __begin2 = (const_iterator)pCStack_28;
        __end2 = absl::
                 InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                 ::begin(pCStack_28);
        e_1 = absl::
              InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
              ::end((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                     *)__begin2);
        for (; __end2 != e_1; __end2 = __end2 + 1) {
          local_e0 = __end2;
          iStack_e4 = GetVertexRank(this,__end2);
          piVar8 = std::min<int>(&local_b8,&stack0xffffffffffffff1c);
          local_b8 = *piVar8;
          local_e8 = GetVertexRank(this,local_e0);
          piVar8 = std::max<int>((int *)((long)&__range2 + 4),&local_e8);
          __range2._4_4_ = *piVar8;
        }
        if ((b_first <= local_b8) && (__range2._4_4_ <= b_last)) {
          if ((hi._3_1_ & 1) != 0) {
            std::swap<int>(&local_80,(int *)((long)&__range1 + 4));
          }
          best._3_1_ = EdgeChainOnLeft(this,(vector<int,_std::allocator<int>_> *)b_local,local_80,
                                       __range1._4_4_);
          if ((local_29 & 1) == best._3_1_) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->rank_,(long)__range1._4_4_);
            local_f0 = *pvVar7 + 1;
            piVar8 = std::max<int>(&b_first,&local_f0);
            b_first = *piVar8;
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->rank_,(long)local_80)
            ;
            piVar8 = std::min<int>(&b_last,pvVar7);
            b_last = *piVar8;
          }
        }
      }
      this_00 = pCStack_28;
      local_f4 = -1;
      if (b_last < b_first) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_108,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x293,kFatal,(ostream *)&std::cerr);
        poVar9 = S2LogMessage::stream(&local_108);
        poVar9 = std::operator<<(poVar9,"Check failed: (lo) <= (hi) ");
        S2LogMessageVoidify::operator&(&local_f5,poVar9);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_108);
      }
      __end1_1 = absl::
                 InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                 ::begin(pCStack_28);
      pCVar10 = absl::
                InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                ::end(this_00);
      for (; __end1_1 != pCVar10; __end1_1 = __end1_1 + 1) {
        iVar3 = __end1_1->a_index;
        iVar4 = GetVertexRank(this,__end1_1);
        if ((b_first <= iVar4) && (iVar4 <= b_last)) {
          if (-1 < local_f4) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)b_local,(long)iVar3);
            iVar4 = *pvVar7;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)b_local,(long)local_f4);
            if (*pvVar7 <= iVar4) goto LAB_003b037d;
          }
          local_f4 = iVar3;
        }
LAB_003b037d:
      }
      this_local._4_4_ = local_f4;
    }
  }
  return this_local._4_4_;
}

Assistant:

int GraphEdgeClipper::GetCrossedVertexIndex(
    const vector<VertexId>& a, const CrossingGraphEdgeVector& b,
    bool left_to_right) const {
  S2_DCHECK(!a.empty());
  S2_DCHECK(!b.empty());

  // The reason this calculation is tricky is that after snapping, the A and B
  // chains may meet and separate several times.  For example, if B crosses A
  // from left to right, then B may touch A, make an excursion to the left of
  // A, come back to A, then make an excursion to the right of A and come back
  // to A again, like this:
  //
  //  *--B--*-\             /-*-\
  //           B-\       /-B     B-\      6     7     8     9
  //  *--A--*--A--*-A,B-*--A--*--A--*-A,B-*--A--*--A--*-A,B-*
  //  0     1     2     3     4     5      \-B     B-/
  //                                          \-*-/
  //
  // (where "*" is a vertex, and "A" and "B" are edge labels).  Note that B
  // may also follow A for one or more edges whenever they touch (e.g. between
  // vertices 2 and 3).  In this case the only vertices of A where the
  // crossing could take place are 5 and 6, i.e. after all excursions of B to
  // the left of A, and before all excursions of B to the right of A.
  //
  // Other factors to consider are that the portion of B before and/or after
  // the crossing may be degenerate, and some or all of the B edges may be
  // reversed relative to the A edges.

  // First, check whether edge A is degenerate.
  int n = a.size();
  if (n == 1) return 0;

  // If edge chain B is incident to only one vertex of A, we're done.
  if (b[0].a_index == b.back().a_index) return b[0].a_index;

  // Determine whether the B chain visits the first and last vertices that it
  // shares with the A chain in the same order or the reverse order.  This is
  // only needed to implement one special case (see below).
  bool b_reversed = GetVertexRank(b[0]) > GetVertexRank(b.back());

  // Examine each incident B edge and use it to narrow the range of positions
  // where the crossing could occur in the B chain.  Vertex positions are
  // represented as a range [lo, hi] of vertex ranks in the B chain (see
  // GetVertexRank).
  //
  // Note that if an edge of B is incident to the first or last vertex of A,
  // we can't test which side of the A chain it is on.  (An s2pred::Sign test
  // doesn't work; e.g. if the B edge is XY and the first edge of A is YZ,
  // then snapping can change the sign of XYZ while maintaining topological
  // guarantees.)  There can be up to 4 such edges (one incoming and one
  // outgoing edge at each endpoint of A).  Two of these edges logically
  // extend past the end of the A chain and place no restrictions on the
  // crossing vertex.  The other two edges define the ends of the subchain
  // where B shares vertices with A.  We save these edges in order to handle a
  // special case (see below).
  int lo = -1, hi = order_.size();   // Vertex ranks of acceptable crossings
  EdgeId b_first = -1, b_last = -1;  // "b" subchain connecting "a" endpoints
  for (const auto& e : b) {
    int ai = e.a_index;
    if (ai == 0) {
      if (e.outgoing != b_reversed && e.dst != a[1]) b_first = e.id;
    } else if (ai == n - 1) {
      if (e.outgoing == b_reversed && e.dst != a[n - 2]) b_last = e.id;
    } else {
      // This B edge is incident to an interior vertex of the A chain.  First
      // check whether this edge is identical (or reversed) to an edge in the
      // A chain, in which case it does not create any restrictions.
      if (e.dst == a[ai - 1] || e.dst == a[ai + 1]) continue;

      // Otherwise we can test which side of the A chain the edge lies on.
      bool on_left = s2pred::OrderedCCW(g_.vertex(a[ai + 1]), g_.vertex(e.dst),
                                        g_.vertex(a[ai - 1]), g_.vertex(a[ai]));

      // Every B edge that is incident to an interior vertex of the A chain
      // places some restriction on where the crossing vertex could be.
      if (left_to_right == on_left) {
        // This is a pre-crossing edge, so the crossing cannot be before the
        // destination vertex of this edge.  (For example, the input B edge
        // crosses the input A edge from left to right and this edge of the B
        // chain is to the left of the A chain.)
        lo = max(lo, rank_[e.id] + 1);
      } else {
        // This is a post-crossing edge, so the crossing cannot be after the
        // source vertex of this edge.
        hi = min(hi, rank_[e.id]);
      }
    }
  }
  // There is one special case.  If a subchain of B connects the first and
  // last vertices of A, then together with the edges of A this forms a loop
  // whose orientation can be tested to determine whether B is on the left or
  // right side of A.  This is only possible (and only necessary) if the B
  // subchain does not include any interior vertices of A, since otherwise the
  // B chain might cross from one side of A to the other.
  //
  // Note that it would be possible to avoid this test in some situations by
  // checking whether either endpoint of the A chain has two incident B edges,
  // in which case we could check which side of the B chain the A edge is on
  // and use this to limit the possible crossing locations.
  if (b_first >= 0 && b_last >= 0) {
    // The B subchain connects the first and last vertices of A.  Test whether
    // the chain includes any interior vertices of A.  We do this indirectly
    // by testing whether any edge of B has restricted the range of allowable
    // crossing vertices (since any interior edge of the B subchain incident
    // to any interior edge of A is guaranteed to do so).
    int min_rank = order_.size(), max_rank = -1;
    for (const auto& e : b) {
      min_rank = min(min_rank, GetVertexRank(e));
      max_rank = max(max_rank, GetVertexRank(e));
    }
    if (lo <= min_rank && hi >= max_rank) {
      // The B subchain is not incident to any interior vertex of A.
      // Swap the edges if necessary so that they are in B chain order.
      if (b_reversed) swap(b_first, b_last);
      bool on_left = EdgeChainOnLeft(a, b_first, b_last);
      if (left_to_right == on_left) {
        lo = max(lo, rank_[b_last] + 1);
      } else {
        hi = min(hi, rank_[b_first]);
      }
    }
  }

  // Otherwise we choose the smallest shared VertexId in the acceptable range,
  // in order to ensure that both chains choose the same crossing vertex.
  int best = -1;
  S2_DCHECK_LE(lo, hi);
  for (const auto& e : b) {
    int ai = e.a_index;
    int vrank = GetVertexRank(e);
    if (vrank >= lo && vrank <= hi && (best < 0 || a[ai] < a[best])) {
      best = ai;
    }
  }
  return best;
}